

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

Elem * new_term_string(Grammar *g,char *s,char *e,Rule *r)

{
  Term **ppTVar1;
  Elem **ppEVar2;
  uint uVar3;
  Term **ppTVar4;
  Elem **ppEVar5;
  Term *elem;
  char *__dest;
  Elem *elem_00;
  anon_struct_40_4_d8687ec6_for_elems *v;
  size_t __n;
  anon_struct_40_4_d8687ec6_for_terminals *v_00;
  
  elem = new_term();
  __n = (long)e - (long)s;
  __dest = (char *)malloc(__n + 1);
  elem->string = __dest;
  memcpy(__dest,s,__n);
  __dest[__n] = '\0';
  elem->string_len = (int)__n;
  ppTVar4 = (g->terminals).v;
  ppTVar1 = (g->terminals).e;
  if (ppTVar4 == (Term **)0x0) {
    (g->terminals).v = ppTVar1;
    uVar3 = (g->terminals).n;
    (g->terminals).n = uVar3 + 1;
    (g->terminals).e[uVar3] = elem;
  }
  else {
    v_00 = &g->terminals;
    uVar3 = v_00->n;
    if (ppTVar4 == ppTVar1) {
      if (2 < uVar3) goto LAB_00139d9d;
    }
    else if ((uVar3 & 7) == 0) {
LAB_00139d9d:
      vec_add_internal(v_00,elem);
      goto LAB_00139da8;
    }
    v_00->n = uVar3 + 1;
    ppTVar4[uVar3] = elem;
  }
LAB_00139da8:
  elem_00 = new_elem();
  elem_00->kind = ELEM_TERM;
  (elem_00->e).term = elem;
  elem_00->rule = r;
  ppEVar5 = (r->elems).v;
  ppEVar2 = (r->elems).e;
  if (ppEVar5 == (Elem **)0x0) {
    (r->elems).v = ppEVar2;
    uVar3 = (r->elems).n;
    (r->elems).n = uVar3 + 1;
    (r->elems).e[uVar3] = elem_00;
    return elem_00;
  }
  v = &r->elems;
  uVar3 = v->n;
  if (ppEVar5 == ppEVar2) {
    if (2 < uVar3) goto LAB_00139dff;
  }
  else if ((uVar3 & 7) == 0) {
LAB_00139dff:
    vec_add_internal(v,elem_00);
    return elem_00;
  }
  v->n = uVar3 + 1;
  ppEVar5[uVar3] = elem_00;
  return elem_00;
}

Assistant:

static Elem *new_term_string(Grammar *g, char *s, char *e, Rule *r) {
  Term *t = new_term();
  Elem *elem;

  t->string = MALLOC(e - s + 1);
  memcpy(t->string, s, e - s);
  t->string[e - s] = 0;
  t->string_len = e - s;
  vec_add(&g->terminals, t);
  elem = new_elem_term(t, r);
  return elem;
}